

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puff.cpp
# Opt level: O0

int stored(state *s)

{
  uchar uVar1;
  unsigned_long uVar2;
  uint local_1c;
  uint len;
  state *s_local;
  
  s->bitbuf = 0;
  s->bitcnt = 0;
  if (s->inlen < s->incnt + 4) {
    s_local._4_4_ = 2;
  }
  else {
    uVar2 = s->incnt;
    s->incnt = uVar2 + 1;
    uVar1 = s->in[uVar2];
    uVar2 = s->incnt;
    s->incnt = uVar2 + 1;
    local_1c = (uint)CONCAT11(s->in[uVar2],uVar1);
    uVar2 = s->incnt;
    s->incnt = uVar2 + 1;
    if (((uint)s->in[uVar2] == ((local_1c ^ 0xffffffff) & 0xff)) &&
       (uVar2 = s->incnt, s->incnt = uVar2 + 1,
       (uint)s->in[uVar2] == ((local_1c ^ 0xffffffff) >> 8 & 0xff))) {
      if (s->inlen < s->incnt + (ulong)local_1c) {
        s_local._4_4_ = 2;
      }
      else {
        if (s->out == (uchar *)0x0) {
          s->outcnt = (ulong)local_1c + s->outcnt;
          s->incnt = (ulong)local_1c + s->incnt;
        }
        else {
          if (s->outlen < s->outcnt + (ulong)local_1c) {
            return 1;
          }
          while (local_1c != 0) {
            uVar2 = s->incnt;
            s->incnt = uVar2 + 1;
            uVar1 = s->in[uVar2];
            uVar2 = s->outcnt;
            s->outcnt = uVar2 + 1;
            s->out[uVar2] = uVar1;
            local_1c = local_1c - 1;
          }
        }
        s_local._4_4_ = 0;
      }
    }
    else {
      s_local._4_4_ = -2;
    }
  }
  return s_local._4_4_;
}

Assistant:

local int stored(struct state *s)
{
    unsigned len;       /* length of stored block */

    /* discard leftover bits from current byte (assumes s->bitcnt < 8) */
    s->bitbuf = 0;
    s->bitcnt = 0;

    /* get length and check against its one's complement */
    if (s->incnt + 4 > s->inlen)
        return 2;                               /* not enough input */
    len = s->in[s->incnt++];
    len |= s->in[s->incnt++] << 8;
    if (s->in[s->incnt++] != (~len & 0xff) ||
        s->in[s->incnt++] != ((~len >> 8) & 0xff))
        return -2;                              /* didn't match complement! */

    /* copy len bytes from in to out */
    if (s->incnt + len > s->inlen)
        return 2;                               /* not enough input */
    if (s->out != nullptr) {
        if (s->outcnt + len > s->outlen)
            return 1;                           /* not enough output space */
        while (len--)
            s->out[s->outcnt++] = s->in[s->incnt++];
    }
    else {                                      /* just scanning */
        s->outcnt += len;
        s->incnt += len;
    }

    /* done with a valid stored block */
    return 0;
}